

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O2

int SUNLinSolInitialize_SPTFQMR(SUNLinearSolver S)

{
  int *piVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    piVar1 = (int *)S->content;
    if (2 < piVar1[1] - 1U) {
      piVar1[1] = 0;
    }
    if (*piVar1 < 1) {
      *piVar1 = 5;
    }
    piVar1[6] = 0;
    piVar1[7] = 0;
    return 0;
  }
  return -1;
}

Assistant:

int SUNLinSolInitialize_SPTFQMR(SUNLinearSolver S)
{
  SUNLinearSolverContent_SPTFQMR content;

  /* set shortcut to SPTFQMR memory structure */
  if (S == NULL) return(SUNLS_MEM_NULL);  
  content = SPTFQMR_CONTENT(S);

  /* ensure valid options */
  if ( (content->pretype != PREC_LEFT) && 
       (content->pretype != PREC_RIGHT) && 
       (content->pretype != PREC_BOTH) )
    content->pretype = PREC_NONE;
  if (content->maxl <= 0) 
    content->maxl = SUNSPTFQMR_MAXL_DEFAULT;

  /* no additional memory to allocate */
  
  /* return with success */
  content->last_flag = SUNLS_SUCCESS;
  return(SUNLS_SUCCESS);
}